

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O2

int lua_isnumber(lua_State *L,int idx)

{
  int iVar1;
  TValue *pTVar2;
  TValue tmp;
  
  pTVar2 = index2adr(L,idx);
  if ((pTVar2->field_2).it < 0xffff0000) {
    iVar1 = 1;
  }
  else {
    iVar1 = 0;
    if ((pTVar2->field_2).it == 0xfffffffb) {
      iVar1 = lj_strscan_num((GCstr *)(ulong)(pTVar2->u32).lo,&tmp);
    }
  }
  return iVar1;
}

Assistant:

LUA_API int lua_isnumber(lua_State *L, int idx)
{
  cTValue *o = index2adr(L, idx);
  TValue tmp;
  return (tvisnumber(o) || (tvisstr(o) && lj_strscan_number(strV(o), &tmp)));
}